

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O0

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_-1>
::LinearizeQPTerm(QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,__1>
                  *this,double c,int x,int y)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  LinTerms *in_RDI;
  int in_stack_000000c8;
  int in_stack_000000cc;
  double in_stack_000000d0;
  QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,__1>
  *in_stack_000000d8;
  int in_stack_00000368;
  int in_stack_0000036c;
  double in_stack_00000370;
  QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,__1>
  *in_stack_00000378;
  
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RSI);
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                    ((FlatModel<mp::DefaultFlatModelParams> *)CONCAT44(in_EDX,in_ECX),
                     (int)((ulong)in_RSI >> 0x20));
  if (!bVar1) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RSI);
    bVar1 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                      ((FlatModel<mp::DefaultFlatModelParams> *)CONCAT44(in_EDX,in_ECX),
                       (int)((ulong)in_RSI >> 0x20));
    if (!bVar1) {
      LinearizeGeneralProduct
                (in_stack_00000378,in_stack_00000370,in_stack_0000036c,in_stack_00000368);
      return in_RDI;
    }
  }
  LinearizeProductWithBinaryVar
            (in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  return in_RDI;
}

Assistant:

LinTerms LinearizeQPTerm(double c, int x, int y) {
    if (GetMC().is_binary_var(x) ||
        GetMC().is_binary_var(y))
      return LinearizeProductWithBinaryVar(c, x, y);
    return LinearizeGeneralProduct(c, x, y);
  }